

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gain_interpolator_tests.cpp
# Opt level: O3

void apply_interp<ear::dsp::LinearInterpSingle,Eigen::VectorBlock<Eigen::Matrix<float,_1,1,0,_1,1>,_1>,Eigen::VectorBlock<Eigen::Matrix<float,_1,1,0,_1,1>,_1>,float>
               (VectorBlock<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1> *in,
               VectorBlock<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1> *out,SampleIndex block_start,
               SampleIndex start,SampleIndex end,float *start_point,float *end_point)

{
  long lVar1;
  long lVar2;
  long lVar3;
  value_type *__val;
  long lVar4;
  float fVar5;
  long *local_60;
  long *local_58;
  long *local_50;
  long *local_48;
  long *local_40;
  long *local_38;
  
  local_60 = (long *)operator_new(8);
  local_58 = local_60 + 1;
  *local_60 = 0;
  local_50 = local_58;
  ear::dsp::PtrAdapterT<float*>::set_eigen<Eigen::VectorBlock<Eigen::Matrix<float,_1,1,0,_1,1>,_1>&>
            ((PtrAdapterT<float*> *)&local_60,in,0);
  local_48 = (long *)operator_new(8);
  local_40 = local_48 + 1;
  *local_48 = 0;
  local_38 = local_40;
  ear::dsp::PtrAdapterT<float*>::set_eigen<Eigen::VectorBlock<Eigen::Matrix<float,_1,1,0,_1,1>,_1>&>
            ((PtrAdapterT<float*> *)&local_48,out,0);
  lVar1 = (in->super_Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>).
          super_BlockImpl<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>.m_rows
          .m_value;
  if (0 < lVar1) {
    lVar2 = *local_60;
    lVar3 = *local_48;
    lVar4 = 0;
    do {
      fVar5 = (float)((block_start - start) + lVar4) * (1.0 / (float)(end - start));
      *(float *)(lVar3 + lVar4 * 4) =
           ((1.0 - fVar5) * *start_point + fVar5 * *end_point) * *(float *)(lVar2 + lVar4 * 4);
      lVar4 = lVar4 + 1;
    } while (lVar1 != lVar4);
  }
  if (local_48 != (long *)0x0) {
    operator_delete(local_48,(long)local_38 - (long)local_48);
  }
  if (local_60 != (long *)0x0) {
    operator_delete(local_60,(long)local_50 - (long)local_60);
  }
  return;
}

Assistant:

void apply_interp(In &&in, Out &&out, SampleIndex block_start,
                  SampleIndex start, SampleIndex end, const Point &start_point,
                  const Point &end_point) {
  PtrAdapter in_p(in.cols());
  in_p.set_eigen(in);
  PtrAdapter out_p(out.cols());
  out_p.set_eigen(out);

  Interp::apply_interp(in_p.ptrs(), out_p.ptrs(), 0, (SampleIndex)in.rows(),
                       block_start, start, end, start_point, end_point);
}